

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

Matrix<double,_4,_4> *
gl4cts::Math::inverse<4>(Matrix<double,_4,_4> *__return_storage_ptr__,Matrix<double,_4,_4> *matrix)

{
  Vector<double,_4> *pVVar1;
  GLuint c_1;
  ulong uVar2;
  Matrix<double,_4,_4> *extraout_RDX;
  Matrix<double,_4,_4> *mat;
  Matrix<double,_4,_4> *extraout_RDX_00;
  GLuint r;
  ulong uVar3;
  ulong uVar4;
  GLuint c;
  ulong uVar5;
  double dVar6;
  Matrix<double,_4,_4> adjugate;
  Matrix<double,_4,_4> cof;
  Matrix<double,_4,_4> local_130;
  Matrix<double,_4,_4> local_b0;
  
  tcu::Matrix<double,_4,_4>::Matrix(&local_b0);
  mat = extraout_RDX;
  for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
    for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
      tcu::Matrix<double,_3,_3>::Matrix((Matrix<double,_3,_3> *)&local_130);
      pVVar1 = (Vector<double,_4> *)matrix;
      for (uVar2 = 0; uVar2 != 4; uVar2 = uVar2 + 1) {
        if (uVar2 != uVar5) {
          for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
            if (uVar3 != uVar4) {
              local_130.m_data.m_data[0].m_data
              [(long)(int)((int)uVar2 - (uint)(uVar5 < uVar2)) * 3 +
               (long)(int)((int)uVar4 - (uint)(uVar3 < uVar4))] = pVVar1->m_data[uVar4];
            }
          }
        }
        pVVar1 = pVVar1 + 1;
      }
      dVar6 = determinant<double>((Matrix<double,_3,_3> *)&local_130);
      if (((int)uVar5 + (int)uVar3 & 1U) != 0) {
        dVar6 = -dVar6;
      }
      local_b0.m_data.m_data[uVar5].m_data[uVar3] = dVar6;
      mat = extraout_RDX_00;
    }
  }
  tcu::transpose<double,4,4>(&local_130,(tcu *)&local_b0,mat);
  dVar6 = determinant<double>(matrix);
  tcu::operator*(__return_storage_ptr__,&local_130,1.0 / dVar6);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}